

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void mtree_indent(mtree_writer *mtree)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *local_38;
  char *x;
  char *s;
  char *r;
  wchar_t pd;
  wchar_t nd;
  wchar_t fn;
  wchar_t i;
  mtree_writer *mtree_local;
  
  if (mtree->classic == L'\0') {
    r._0_4_ = 0;
    r._4_4_ = 0;
  }
  else if (mtree->indent == L'\0') {
    r._4_4_ = 0;
    if (mtree->depth != L'\0') {
      r._4_4_ = 4;
    }
    r._0_4_ = 0;
  }
  else {
    r._4_4_ = 0;
    r._0_4_ = mtree->depth << 2;
  }
  bVar1 = true;
  x = (mtree->ebuf).s;
  local_38 = (char *)0x0;
  for (s = x; *s == ' '; s = s + 1) {
  }
  while (pcVar2 = strchr(s,0x20), pcVar2 != (char *)0x0) {
    if (bVar1) {
      bVar1 = false;
      for (nd = L'\0'; nd < r._4_4_ + (int)r; nd = nd + L'\x01') {
        archive_strappend_char(&mtree->buf,' ');
      }
      archive_strncat(&mtree->buf,x,(long)pcVar2 - (long)x);
      if ((long)(pcVar2 + ((long)r._4_4_ - (long)x)) < 0x10) {
        for (nd = ((int)pcVar2 - (int)x) + r._4_4_; nd < L'\x10'; nd = nd + L'\x01') {
          archive_strappend_char(&mtree->buf,' ');
        }
      }
      else {
        archive_strncat(&mtree->buf," \\\n",3);
        for (nd = L'\0'; nd < (int)r + L'\x10'; nd = nd + L'\x01') {
          archive_strappend_char(&mtree->buf,' ');
        }
      }
      x = pcVar2 + 1;
      local_38 = (char *)0x0;
      s = x;
    }
    else if ((long)(pcVar2 + ((long)(int)r - (long)x)) < 0x3f) {
      s = pcVar2 + 1;
      local_38 = pcVar2;
    }
    else {
      if (local_38 == (char *)0x0) {
        local_38 = pcVar2;
      }
      archive_strncat(&mtree->buf,x,(long)local_38 - (long)x);
      archive_strncat(&mtree->buf," \\\n",3);
      for (nd = L'\0'; nd < (int)r + L'\x10'; nd = nd + L'\x01') {
        archive_strappend_char(&mtree->buf,' ');
      }
      x = local_38 + 1;
      local_38 = (char *)0x0;
      s = x;
    }
  }
  if (bVar1) {
    for (nd = L'\0'; nd < r._4_4_ + (int)r; nd = nd + L'\x01') {
      archive_strappend_char(&mtree->buf,' ');
    }
    archive_strcat(&mtree->buf,x);
    sVar3 = strlen(x);
    x = x + sVar3;
  }
  if ((local_38 != (char *)0x0) && (sVar3 = strlen(x), 0x3e < (long)(int)r + sVar3)) {
    archive_strncat(&mtree->buf,x,(long)local_38 - (long)x);
    archive_strncat(&mtree->buf," \\\n",3);
    for (nd = L'\0'; nd < (int)r + L'\x10'; nd = nd + L'\x01') {
      archive_strappend_char(&mtree->buf,' ');
    }
    x = local_38 + 1;
  }
  archive_strcat(&mtree->buf,x);
  (mtree->ebuf).length = 0;
  return;
}

Assistant:

static void
mtree_indent(struct mtree_writer *mtree)
{
	int i, fn, nd, pd;
	const char *r, *s, *x;

	if (mtree->classic) {
		if (mtree->indent) {
			nd = 0;
			pd = mtree->depth * 4;
		} else {
			nd = mtree->depth?4:0;
			pd = 0;
		}
	} else
		nd = pd = 0;
	fn = 1;
	s = r = mtree->ebuf.s;
	x = NULL;
	while (*r == ' ')
		r++;
	while ((r = strchr(r, ' ')) != NULL) {
		if (fn) {
			fn = 0;
			for (i = 0; i < nd + pd; i++)
				archive_strappend_char(&mtree->buf, ' ');
			archive_strncat(&mtree->buf, s, r - s);
			if (nd + (r -s) > INDENTNAMELEN) {
				archive_strncat(&mtree->buf, " \\\n", 3);
				for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
					archive_strappend_char(&mtree->buf, ' ');
			} else {
				for (i = (int)(r -s + nd);
				    i < (INDENTNAMELEN + 1); i++)
					archive_strappend_char(&mtree->buf, ' ');
			}
			s = ++r;
			x = NULL;
			continue;
		}
		if (pd + (r - s) <= MAXLINELEN - 3 - INDENTNAMELEN)
			x = r++;
		else {
			if (x == NULL)
				x = r;
			archive_strncat(&mtree->buf, s, x - s);
			archive_strncat(&mtree->buf, " \\\n", 3);
			for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
				archive_strappend_char(&mtree->buf, ' ');
			s = r = ++x;
			x = NULL;
		}
	}
	if (fn) {
		for (i = 0; i < nd + pd; i++)
			archive_strappend_char(&mtree->buf, ' ');
		archive_strcat(&mtree->buf, s);
		s += strlen(s);
	}
	if (x != NULL && pd + strlen(s) > MAXLINELEN - 3 - INDENTNAMELEN) {
		/* Last keyword is longer. */
		archive_strncat(&mtree->buf, s, x - s);
		archive_strncat(&mtree->buf, " \\\n", 3);
		for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
			archive_strappend_char(&mtree->buf, ' ');
		s = ++x;
	}
	archive_strcat(&mtree->buf, s);
	archive_string_empty(&mtree->ebuf);
}